

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

size_t __thiscall
(anonymous_namespace)::ExprHasher::
VisitVarArg<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)66,(mp::expr::Kind)67>>
          (ExprHasher *this,
          BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)66,_(mp::expr::Kind)67>
          e)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  ExprHasher *this_00;
  size_t sVar4;
  
  sVar4 = (long)*(int *)this + 0x9e3779b9;
  iVar1 = *(int *)(this + 4);
  if ((long)iVar1 != 0) {
    lVar3 = 0;
    this_00 = this;
    do {
      sVar2 = std::hash<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>::operator()
                        ((hash<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_> *)this_00,
                         (Expr)*(Impl **)(this + lVar3 + 8));
      sVar4 = sVar4 * 0x40 + 0x9e3779b9 + (sVar4 >> 2) + sVar2 ^ sVar4;
      lVar3 = lVar3 + 8;
    } while ((long)iVar1 * 8 != lVar3);
  }
  return sVar4;
}

Assistant:

size_t VisitVarArg(E e) {
    size_t hash = Hash(e);
    for (typename E::iterator i = e.begin(), end = e.end(); i != end; ++i)
      hash = HashCombine(hash, *i);
    return hash;
  }